

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

sftp_cmd_lookup * lookup_command(char *name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int cmp;
  int k;
  int j;
  int i;
  char *name_local;
  
  k = -1;
  cmp = 0x1c;
  iVar1 = cmp;
  do {
    cmp = iVar1;
    if (cmp - k < 2) {
      return (sftp_cmd_lookup *)0x0;
    }
    iVar2 = (cmp + k) / 2;
    iVar3 = strcmp(name,sftp_lookup[iVar2].name);
    iVar1 = iVar2;
  } while ((iVar3 < 0) || (iVar1 = cmp, k = iVar2, 0 < iVar3));
  return sftp_lookup + iVar2;
}

Assistant:

const struct sftp_cmd_lookup *lookup_command(const char *name)
{
    int i, j, k, cmp;

    i = -1;
    j = lenof(sftp_lookup);
    while (j - i > 1) {
        k = (j + i) / 2;
        cmp = strcmp(name, sftp_lookup[k].name);
        if (cmp < 0)
            j = k;
        else if (cmp > 0)
            i = k;
        else {
            return &sftp_lookup[k];
        }
    }
    return NULL;
}